

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QMainWindowTabBar::mouseReleaseEvent(QMainWindowTabBar *this,QMouseEvent *e)

{
  DragState *pDVar1;
  bool bVar2;
  
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(this + 0x30));
  if ((bVar2) && (*(int *)(e + 0x40) == 1)) {
    pDVar1 = (*(QDockWidgetPrivate **)(*(long *)(this + 0x38) + 8))->state;
    if ((pDVar1 != (DragState *)0x0) && (pDVar1->dragging == true)) {
      QDockWidgetPrivate::endDrag
                (*(QDockWidgetPrivate **)(*(long *)(this + 0x38) + 8),LocationChange);
    }
    QWeakPointer<QObject>::assign<QObject>((QWeakPointer<QObject> *)(this + 0x30),(QObject *)0x0);
  }
  QTabBar::mouseReleaseEvent((QTabBar *)this,e);
  return;
}

Assistant:

void QMainWindowTabBar::mouseReleaseEvent(QMouseEvent *e)
{
    if (draggingDock && e->button() == Qt::LeftButton) {
        QDockWidgetPrivate *dockPriv = static_cast<QDockWidgetPrivate *>(QObjectPrivate::get(draggingDock));
        if (dockPriv->state && dockPriv->state->dragging)
            dockPriv->endDrag(QDockWidgetPrivate::EndDragMode::LocationChange);

        draggingDock = nullptr;
    }
    QTabBar::mouseReleaseEvent(e);
}